

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_stepping.cpp
# Opt level: O3

void test_2d_static<1ul,1ul,30ul,30ul>(void)

{
  bool *pbVar1;
  long lVar2;
  value_type true_idx;
  int dptr [900];
  bool *local_e70;
  bool *local_e68;
  bool *local_e60;
  long local_e58;
  bool *local_e50;
  bool local_e48 [3608];
  
  local_e48[0] = true;
  local_e68 = (bool *)CONCAT71(local_e68._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xb7,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",local_e48,
             (bool *)&local_e68);
  local_e48[0] = true;
  local_e48[1] = false;
  local_e48[2] = false;
  local_e48[3] = false;
  local_e48[4] = false;
  local_e48[5] = false;
  local_e48[6] = false;
  local_e48[7] = false;
  local_e68._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xb9,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_e48,(int *)&local_e68);
  local_e48[0] = true;
  local_e48[1] = false;
  local_e48[2] = false;
  local_e48[3] = false;
  local_e48[4] = false;
  local_e48[5] = false;
  local_e48[6] = false;
  local_e48[7] = false;
  local_e68 = (bool *)CONCAT44(local_e68._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xba,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_e48,(int *)&local_e68);
  local_e48[0] = true;
  local_e48[1] = true;
  local_e48[2] = false;
  local_e48[3] = false;
  local_e48[4] = false;
  local_e48[5] = false;
  local_e48[6] = false;
  local_e48[7] = false;
  local_e68 = (bool *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xbc,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_e48,(unsigned_long *)&local_e68);
  local_e48[0] = true;
  local_e48[1] = true;
  local_e48[2] = false;
  local_e48[3] = false;
  local_e48[4] = false;
  local_e48[5] = false;
  local_e48[6] = false;
  local_e48[7] = false;
  local_e68 = (bool *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xbd,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_e48,(unsigned_long *)&local_e68);
  local_e48[0] = true;
  local_e68 = (bool *)CONCAT71(local_e68._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc3,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",local_e48,
             (bool *)&local_e68);
  local_e48[0] = true;
  local_e48[1] = false;
  local_e48[2] = false;
  local_e48[3] = false;
  local_e48[4] = false;
  local_e48[5] = false;
  local_e48[6] = false;
  local_e48[7] = false;
  local_e68 = (bool *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","N",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc5,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_e48,(unsigned_long *)&local_e68);
  local_e48[0] = true;
  local_e48[1] = false;
  local_e48[2] = false;
  local_e48[3] = false;
  local_e48[4] = false;
  local_e48[5] = false;
  local_e48[6] = false;
  local_e48[7] = false;
  local_e68 = (bool *)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","M",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc6,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_e48,(unsigned_long *)&local_e68);
  local_e48[0] = true;
  local_e48[1] = true;
  local_e48[2] = false;
  local_e48[3] = false;
  local_e48[4] = false;
  local_e48[5] = false;
  local_e48[6] = false;
  local_e48[7] = false;
  local_e68 = (bool *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / N) * (Y / M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,200,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_e48,(unsigned_long *)&local_e68);
  local_e48[0] = true;
  local_e48[1] = true;
  local_e48[2] = false;
  local_e48[3] = false;
  local_e48[4] = false;
  local_e48[5] = false;
  local_e48[6] = false;
  local_e48[7] = false;
  local_e68 = (bool *)0x384;
  pbVar1 = local_e48;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
             ,0xc9,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)pbVar1,(unsigned_long *)&local_e68);
  local_e58 = 0;
  do {
    lVar2 = 0;
    local_e60 = pbVar1;
    do {
      local_e70 = (bool *)(local_e58 + lVar2);
      local_e68 = local_e70;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xd3,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_e70,(unsigned_long *)&local_e68);
      local_e50 = local_e48 + (long)local_e68 * 4;
      local_e70 = pbVar1;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xd5,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (int **)&local_e70,(int **)&local_e50);
      pbVar1[0] = true;
      pbVar1[1] = false;
      pbVar1[2] = false;
      pbVar1[3] = false;
      local_e70 = (bool *)CONCAT44(local_e70._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xd9,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",(int *)pbVar1,
                 (int *)&local_e70);
      lVar2 = lVar2 + 0x1e;
      pbVar1 = pbVar1 + 0x78;
    } while (lVar2 != 900);
    local_e58 = local_e58 + 1;
    pbVar1 = local_e60 + 4;
  } while (local_e58 != 0x1e);
  pbVar1 = local_e48;
  local_e58 = 0;
  do {
    lVar2 = 0;
    local_e60 = pbVar1;
    do {
      local_e70 = (bool *)(local_e58 + lVar2);
      local_e68 = local_e70;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xe3,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_e70,(unsigned_long *)&local_e68);
      local_e50 = local_e48 + (long)local_e68 * 4;
      local_e70 = pbVar1;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xe5,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (int **)&local_e70,(int **)&local_e50);
      pbVar1[0] = true;
      pbVar1[1] = false;
      pbVar1[2] = false;
      pbVar1[3] = false;
      local_e70 = (bool *)CONCAT44(local_e70._4_4_,0x11);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xe9,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",(int *)pbVar1,
                 (int *)&local_e70);
      lVar2 = lVar2 + 0x1e;
      pbVar1 = pbVar1 + 0x78;
    } while (lVar2 != 900);
    local_e58 = local_e58 + 1;
    pbVar1 = local_e60 + 4;
  } while (local_e58 != 0x1e);
  pbVar1 = local_e48;
  local_e58 = 0;
  do {
    lVar2 = 0;
    local_e60 = pbVar1;
    do {
      local_e70 = (bool *)(local_e58 + lVar2);
      local_e68 = local_e70;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xf2,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_e70,(unsigned_long *)&local_e68);
      local_e70 = (bool *)CONCAT44(local_e70._4_4_,0x11);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","17",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_stepping.cpp"
                 ,0xf9,"void test_2d_static() [N = 1UL, M = 1UL, X = 30UL, Y = 30UL]",(int *)pbVar1,
                 (int *)&local_e70);
      lVar2 = lVar2 + 0x1e;
      pbVar1 = pbVar1 + 0x78;
    } while (lVar2 != 900);
    local_e58 = local_e58 + 1;
    pbVar1 = local_e60 + 4;
  } while (local_e58 != 0x1e);
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    static_assert(0 == (X % N), "X must be divisable by N");
    static_assert(0 == (Y % M), "Y must be divisable by M");

    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<0, 0>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), X * Y);

    layout_mapping_right<
        dimensions<X / N, Y / M>, dimensions<N, M>, dimensions<0, 0> 
    > const sub_l{};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), N);
    BOOST_TEST_EQ((sub_l.stride(1)), M);

    BOOST_TEST_EQ((sub_l.size()), (X / N) * (Y / M));
    BOOST_TEST_EQ((sub_l.span()), X * Y);

    int dptr[X * Y];

    // Set all elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set every (Nth, Mth) element to 17.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const s = sub_l.stepping();
        auto const true_idx = (sub_l[1] * s[1]) * (s[0] * i) + (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 17;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 17);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        // Element in the strided sub-box.
        if (  (0 == (i % sub_l.stepping()[0]))
           && (0 == (j % sub_l.stepping()[1]))
           )
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }
        // Element not in the strided sub-box.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}